

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

string * __thiscall
cfd::core::ConvertToString<std::__cxx11::string>
          (string *__return_storage_ptr__,core *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  UniValue json_value;
  string sStack_88;
  UniValue local_68;
  
  std::__cxx11::string::string((string *)&sStack_88,(string *)this);
  UniValue::UniValue(&local_68,&sStack_88);
  std::__cxx11::string::~string((string *)&sStack_88);
  UniValue::write_abi_cxx11_((uint)__return_storage_ptr__,(uint)&local_68);
  UniValue::~UniValue(&local_68);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ConvertToString(const T& value) {  // NOLINT
  UniValue json_value(static_cast<T>(value));
  std::string result = json_value.write();
  return result;
}